

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIF.cpp
# Opt level: O2

Event * __thiscall LIF::update(LIF *this,double n_dt)

{
  LIF_param *pLVar1;
  SpikeEvent *this_00;
  Event *this_01;
  
  this->dt = n_dt;
  if (this->t_rest <= 0.0) {
    pLVar1 = this->param;
    if (pLVar1->u_thresh <= this->u && this->u != pLVar1->u_thresh) {
      this->u = pLVar1->u_rest;
      this->t_rest = pLVar1->tau_rest;
      this_00 = (SpikeEvent *)operator_new(0x28);
      SpikeEvent::SpikeEvent(this_00);
      return &this_00->super_Event;
    }
    integrate(this);
  }
  else {
    this->u = this->param->u_rest;
    this->t_rest = this->t_rest - n_dt;
  }
  this_01 = (Event *)operator_new(0x18);
  NoEvent::NoEvent((NoEvent *)this_01);
  return this_01;
}

Assistant:

Event* LIF::update(double n_dt) {
    dt = n_dt;
    if(t_rest > 0.0) {
        rest();
    }
    else if(u > param->u_thresh) {
        fire();
        return new SpikeEvent();
    }
    else {
        integrate();
    }
    return new NoEvent();
}